

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

void __thiscall
VW::config::typed_option<float>::typed_option
          (typed_option<float> *this,string *name,float *location)

{
  undefined8 in_RDX;
  string *in_RSI;
  string *in_RDI;
  base_option *unaff_retaddr;
  string *this_00;
  type_info *in_stack_ffffffffffffffc0;
  string local_38 [32];
  undefined8 local_18;
  string *name_00;
  
  this_00 = local_38;
  local_18 = in_RDX;
  name_00 = in_RDI;
  std::__cxx11::string::string(this_00,in_RSI);
  std::type_info::hash_code(in_stack_ffffffffffffffc0);
  config::base_option::base_option(unaff_retaddr,name_00,(size_t)in_RSI);
  std::__cxx11::string::~string(local_38);
  *(undefined ***)in_RDI = &PTR__typed_option_00492d30;
  *(undefined8 *)((long)&in_RDI[3].field_2 + 8) = local_18;
  std::shared_ptr<float>::shared_ptr((shared_ptr<float> *)this_00,in_RDI);
  std::shared_ptr<float>::shared_ptr((shared_ptr<float> *)this_00,in_RDI);
  return;
}

Assistant:

typed_option(const std::string& name, T& location) : base_option(name, typeid(T).hash_code()), m_location{location} {}